

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas.c
# Opt level: O0

doublereal Wnrm2_(integer *n,doublereal *x,integer *incx)

{
  bool bVar1;
  doublereal dVar2;
  int *in_RDX;
  long in_RSI;
  int *in_RDI;
  double dVar3;
  doublereal d__3;
  doublereal d__2;
  doublereal d__1;
  doublereal ret_val;
  integer i__2;
  integer i__1;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_30;
  undefined8 local_8;
  
  local_30 = 0.0;
  Wnrm2_::scale = 0.0;
  Wnrm2_::i__ = 1;
  while( true ) {
    dVar2 = Wnrm2_::scale;
    if (*in_RDX < 0) {
      bVar1 = *in_RDI <= Wnrm2_::i__;
    }
    else {
      bVar1 = Wnrm2_::i__ <= *in_RDI;
    }
    if (!bVar1) break;
    local_58 = *(double *)(in_RSI + -8 + (long)Wnrm2_::i__ * 8);
    if (local_58 < 0.0) {
      local_58 = -local_58;
    }
    if (Wnrm2_::scale < local_58) {
      local_60 = local_58;
    }
    else {
      local_60 = Wnrm2_::scale;
    }
    Wnrm2_::scale = local_60;
    Wnrm2_::i__ = *in_RDX + Wnrm2_::i__;
  }
  if ((Wnrm2_::scale != 0.0) || (NAN(Wnrm2_::scale))) {
    Wnrm2_::i__ = 1;
    while( true ) {
      if (*in_RDX < 0) {
        bVar1 = *in_RDI <= Wnrm2_::i__;
      }
      else {
        bVar1 = Wnrm2_::i__ <= *in_RDI;
      }
      if (!bVar1) break;
      dVar3 = *(double *)(in_RSI + -8 + (long)Wnrm2_::i__ * 8) / Wnrm2_::scale;
      local_30 = dVar3 * dVar3 + local_30;
      Wnrm2_::i__ = *in_RDX + Wnrm2_::i__;
    }
    local_8 = sqrt(local_30);
    local_8 = dVar2 * local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

doublereal dnrm2_(integer *n, doublereal *x, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;
    doublereal ret_val, d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer i__;
    static doublereal scale;

/*     ********** */

/*     Function dnrm2 */

/*     Given a vector x of length n, this function calculates the */
/*     Euclidean norm of x with stride incx. */

/*     The function statement is */

/*       double precision function dnrm2(n,x,incx) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*       incx is a positive integer variable that specifies the */
/*         stride of the vector. */

/*     Subprograms called */

/*       FORTRAN-supplied ... abs, max, sqrt */

/*     MINPACK-2 Project. February 1991. */
/*     Argonne National Laboratory. */
/*     Brett M. Averick. */

/*     ********** */
    /* Parameter adjustments */
    --x;

    /* Function Body */
    ret_val = 0.;
    scale = 0.;
    i__1 = *n;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
/* Computing MAX */
	d__2 = scale, d__3 = (d__1 = x[i__], abs(d__1));
	scale = max(d__2,d__3);
/* L10: */
    }
    if (scale == 0.) {
	return ret_val;
    }
    i__2 = *n;
    i__1 = *incx;
    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
/* Computing 2nd power */
	d__1 = x[i__] / scale;
	ret_val += d__1 * d__1;
/* L20: */
    }
    ret_val = scale * sqrt(ret_val);
    return ret_val;
}